

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O1

void pnga_dot_patch(Integer g_a,char *t_a,Integer *alo,Integer *ahi,Integer g_b,char *t_b,
                   Integer *blo,Integer *bhi,void *retval)

{
  int iVar1;
  Integer IVar2;
  Integer IVar3;
  ulong uVar4;
  ulong uVar5;
  logical lVar6;
  ARMCI_Group *group;
  long lVar7;
  int scope;
  long lVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  void *in_stack_fffffffffffff718;
  char transp;
  byte local_8d9;
  byte *local_8d8;
  Integer andim;
  char *A_ptr;
  byte *local_8c0;
  char *B_ptr;
  Integer g_B;
  Integer local_8a8;
  Integer bndim;
  Integer local_898;
  Integer atype;
  Integer local_888;
  Integer local_880;
  Integer btype;
  long local_870;
  Integer loA [7];
  Integer hiA [7];
  Integer hiB [7];
  Integer loB [7];
  Integer ldA [7];
  Integer lo [7];
  Integer ldB [7];
  Integer bdims [7];
  Integer adims [7];
  _iterator_hdl hdl_b;
  _iterator_hdl hdl_a;
  
  local_870 = 0;
  atype = 0;
  btype = 0;
  andim = 0;
  bndim = 0;
  A_ptr = (char *)0x0;
  B_ptr = (char *)0x0;
  local_8d8 = (byte *)t_b;
  local_8c0 = (byte *)t_a;
  g_B = g_b;
  local_8a8 = g_b;
  pnga_nodeid();
  pnga_nnodes();
  bVar10 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar10) {
    pnga_sync();
  }
  IVar2 = pnga_get_pgroup(g_a);
  IVar3 = pnga_get_pgroup(local_8a8);
  if (IVar2 != IVar3) {
    pnga_error("Both arrays must be defined on same group",0);
  }
  local_888 = pnga_pgroup_nodeid(IVar2);
  pnga_inquire(g_a,&atype,&andim,adims);
  pnga_inquire(local_8a8,&btype,&bndim,bdims);
  if (atype != btype) {
    pnga_error(" type mismatch ",0);
  }
  if (0 < andim) {
    lVar9 = 0;
    do {
      if ((alo[lVar9] < 1) || (adims[lVar9] < ahi[lVar9])) {
        pnga_error("g_a indices out of range ",g_a);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < andim);
  }
  local_898 = g_a;
  local_880 = IVar2;
  if (0 < bndim) {
    lVar9 = 0;
    do {
      if ((blo[lVar9] < 1) || (bdims[lVar9] < bhi[lVar9])) {
        pnga_error("g_b indices out of range ",local_8a8);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < bndim);
  }
  lVar9 = 1;
  lVar7 = 1;
  if (0 < andim) {
    lVar8 = 0;
    do {
      lVar7 = lVar7 * ((ahi[lVar8] - alo[lVar8]) + 1);
      lVar8 = lVar8 + 1;
    } while (andim != lVar8);
  }
  if (0 < bndim) {
    lVar9 = 1;
    lVar8 = 0;
    do {
      lVar9 = lVar9 * ((bhi[lVar8] - blo[lVar8]) + 1);
      lVar8 = lVar8 + 1;
    } while (bndim != lVar8);
  }
  if (lVar7 != lVar9) {
    pnga_error("  capacities of patches do not match ",0);
  }
  bVar10 = (*local_8c0 & 0xdf) != 0x4e;
  bVar11 = (*local_8d8 & 0xdf) == 0x4e;
  local_8d9 = bVar11 != bVar10;
  transp = 't';
  if ((bool)local_8d9) {
    transp = 'n';
  }
  uVar4 = pnga_total_blocks(local_898);
  uVar5 = pnga_total_blocks(local_8a8);
  local_8c0 = (byte *)uVar4;
  if ((!bVar11 || bVar10) && -1 < (long)(uVar4 & uVar5)) {
    pnga_error("transpose not supported for block-cyclic data ",0);
  }
  switch(atype) {
  case 0x3e9:
  case 0x3eb:
    *(undefined4 *)retval = 0;
    break;
  case 0x3ea:
  case 0x3ec:
  case 0x3f8:
    *(undefined8 *)retval = 0;
    break;
  default:
    pnga_error("snga_dot_local_patch: type not supported",atype);
    local_8d8 = (byte *)((ulong)local_8d8 & 0xffffffff00000000);
    goto LAB_0011d608;
  case 0x3ee:
    *(undefined8 *)retval = 0;
    goto LAB_0011d600;
  case 0x3ef:
    *(undefined8 *)retval = 0;
    *(undefined8 *)((long)retval + 8) = 0;
LAB_0011d600:
    local_8d8 = (byte *)CONCAT44(local_8d8._4_4_,2);
    goto LAB_0011d608;
  }
  local_8d8 = (byte *)CONCAT44(local_8d8._4_4_,1);
LAB_0011d608:
  IVar3 = local_888;
  IVar2 = local_898;
  if ((long)((ulong)local_8c0 & uVar5) < 0) {
    pnga_distribution(local_898,local_888,loA,hiA);
    pnga_distribution(g_B,IVar3,loB,hiB);
    IVar3 = bndim;
    IVar2 = andim;
    lVar6 = pnga_comp_patch(andim,loA,hiA,bndim,loB,hiB);
    if (lVar6 == 0) {
LAB_0011d6b8:
      local_870 = 0;
    }
    else {
      lVar6 = pnga_comp_patch(IVar2,alo,ahi,IVar3,blo,bhi);
      local_870 = 1;
      if (lVar6 == 0) goto LAB_0011d6b8;
    }
    IVar2 = pnga_type_f2c(0x3f2);
    pnga_gop(IVar2,&local_870,1,"&&");
    if ((local_8d9 & local_870 != 0) == 0) {
      lVar6 = pnga_duplicate(local_898,&g_B,"temp");
      if (lVar6 == 0) {
        pnga_error("duplicate failed",0);
      }
      pnga_copy_patch(&transp,local_8a8,blo,bhi,g_B,alo,ahi);
      bndim = andim;
      pnga_distribution(g_B,local_888,loB,hiB);
      bVar10 = true;
    }
    else {
      bVar10 = false;
    }
    lVar6 = pnga_comp_patch(andim,loA,hiA,bndim,loB,hiB);
    IVar2 = local_898;
    if (lVar6 == 0) {
      pnga_error(" patches mismatch ",0);
    }
    if (bndim < andim) {
      andim = bndim;
    }
    lVar6 = pnga_patch_intersect(alo,ahi,loA,hiA,andim);
    if (lVar6 != 0) {
      pnga_access_ptr(IVar2,loA,hiA,&A_ptr,ldA);
      pnga_access_ptr(g_B,loA,hiA,&B_ptr,ldB);
      snga_dot_local_patch
                (atype,andim,loA,hiA,ldA,A_ptr,B_ptr,(int *)retval,in_stack_fffffffffffff718);
      pnga_release(IVar2,loA,hiA);
      pnga_release(g_B,loA,hiA);
    }
  }
  else {
    lVar6 = pnga_duplicate(local_898,&g_B,"temp");
    if (lVar6 == 0) {
      pnga_error("duplicate failed",0);
    }
    pnga_copy_patch(&transp,local_8a8,blo,bhi,g_B,alo,ahi);
    pnga_local_iterator_init(IVar2,&hdl_a);
    pnga_local_iterator_init(g_B,&hdl_b);
    iVar1 = pnga_local_iterator_next(&hdl_a,loA,hiA,&A_ptr,ldA);
    bVar10 = true;
    if (iVar1 != 0) {
      do {
        pnga_local_iterator_next(&hdl_b,loB,hiB,&B_ptr,ldB);
        IVar2 = andim;
        if (0 < andim) {
          memcpy(lo,loA,andim * 8);
        }
        lVar6 = pnga_patch_intersect(alo,ahi,loA,hiA,IVar2);
        if (lVar6 != 0) {
          if (IVar2 < 2) {
            lVar9 = 1;
            lVar7 = 0;
          }
          else {
            lVar9 = 1;
            lVar7 = 0;
            lVar8 = 0;
            do {
              lVar7 = lVar7 + (loA[lVar8] - lo[lVar8]) * lVar9;
              lVar9 = lVar9 * ldA[lVar8];
              lVar8 = lVar8 + 1;
            } while (IVar2 + -1 != lVar8);
          }
          if (atype - 0x3e9U < 0x10) {
            lVar7 = (loA[IVar2 + -1] - lo[IVar2 + -1]) * lVar9 + lVar7;
            switch(atype) {
            case 0x3e9:
            case 0x3eb:
              lVar7 = lVar7 * 4;
              break;
            case 0x3ea:
            case 0x3ec:
            case 0x3ee:
            case 0x3f8:
              lVar7 = lVar7 * 8;
              break;
            default:
              goto switchD_0011d8a0_caseD_3ed;
            case 0x3ef:
              lVar7 = lVar7 * 0x10;
            }
            A_ptr = A_ptr + lVar7;
            B_ptr = B_ptr + lVar7;
          }
switchD_0011d8a0_caseD_3ed:
          snga_dot_local_patch
                    (atype,IVar2,loA,hiA,ldA,A_ptr,B_ptr,(int *)retval,in_stack_fffffffffffff718);
        }
        iVar1 = pnga_local_iterator_next(&hdl_a,loA,hiA,&A_ptr,ldA);
      } while (iVar1 != 0);
      bVar10 = true;
      IVar2 = local_898;
    }
  }
  if ((atype - 0x3e9U < 0x10) && ((0x806fU >> ((uint)(atype - 0x3e9U) & 0x1f) & 1) != 0)) {
    iVar1 = *(int *)(&DAT_001b21f4 + atype * 4);
  }
  else {
    pnga_error("pnga_dot_patch: type not supported",atype);
    iVar1 = 0;
  }
  lVar6 = pnga_is_mirrored(IVar2);
  if ((lVar6 == 0) || (lVar6 = pnga_is_mirrored(local_8a8), lVar6 == 0)) {
    if (local_880 != -1) {
      group = ga_get_armci_group_((int)local_880);
      armci_msg_group_gop_scope(0x14d,retval,(int)local_8d8,"+",iVar1,group);
      goto LAB_0011db6e;
    }
    scope = 0x14d;
  }
  else {
    scope = 0x151;
  }
  armci_msg_gop_scope(scope,retval,(int)local_8d8,"+",iVar1);
LAB_0011db6e:
  if (bVar10) {
    pnga_destroy(g_B);
  }
  return;
}

Assistant:

void pnga_dot_patch(Integer g_a, char *t_a, Integer *alo, Integer *ahi, Integer g_b, char *t_b, Integer *blo, Integer *bhi, void *retval)
{
  Integer i=0, j=0;
  Integer compatible=0;
  Integer atype=0, btype=0, andim=0, adims[MAXDIM], bndim=0, bdims[MAXDIM];
  Integer loA[MAXDIM], hiA[MAXDIM], ldA[MAXDIM];
  Integer loB[MAXDIM], hiB[MAXDIM], ldB[MAXDIM];
  Integer g_A = g_a, g_B = g_b;
  char *A_ptr=NULL, *B_ptr=NULL;
  Integer ctype=0;
  Integer atotal=0, btotal=0;
  int isum=0, alen=0;
  long lsum=0;
  long long llsum=0;
  double dsum=0;
  DoubleComplex zsum={0,0};
  DoubleComplex csum={0,0};
  float fsum=0;
  Integer me= pnga_nodeid(), temp_created=0;
  Integer nproc = pnga_nnodes();
  Integer num_blocks_a=0, num_blocks_b=0;
  char *tempname = "temp", transp, transp_a, transp_b;
  int local_sync_begin=0;
  Integer a_grp=0, b_grp=0;
  _iterator_hdl hdl_a, hdl_b;

  local_sync_begin = _ga_sync_begin; 
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  a_grp = pnga_get_pgroup(g_a);
  b_grp = pnga_get_pgroup(g_b);
  if (a_grp != b_grp)
    pnga_error("Both arrays must be defined on same group",0L);
  me = pnga_pgroup_nodeid(a_grp);

  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);

  if(atype != btype ) pnga_error(" type mismatch ", 0L);

  /* check if patch indices and g_a dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", g_b);

  /* check if numbers of elements in two patches match each other */
  atotal = 1; for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  btotal = 1; for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);

  if(atotal != btotal)
    pnga_error("  capacities of patches do not match ", 0L);

  /* is transpose operation required ? */
  /* -- only if for one array transpose operation requested*/
  transp_a = (*t_a == 'n' || *t_a =='N')? 'n' : 't';
  transp_b = (*t_b == 'n' || *t_b =='N')? 'n' : 't';
  transp   = (transp_a == transp_b)? 'n' : 't';

  /* Find out if distribution is block-cyclic */
  num_blocks_a = pnga_total_blocks(g_a);
  num_blocks_b = pnga_total_blocks(g_b);

  if (num_blocks_a >= 0 || num_blocks_b >= 0) {
    if (transp_a == 't' || transp_b == 't')
      pnga_error("transpose not supported for block-cyclic data ", 0);
  }

  isum = 0; dsum = 0.; zsum.real = 0.; zsum.imag = 0.; fsum = 0;lsum=0;llsum=0;
  csum.real = 0.; csum.imag = 0.;
  
  switch (atype){
    case C_INT:
      *(int*)retval = isum;
      alen = 1;
      break;                                     
    case C_DCPL:
      ((double*)retval)[0] = zsum.real;
      ((double*)retval)[1] = zsum.imag;
      alen = 2;
      break;                                     
    case C_SCPL:
      ((float*)retval)[0] = csum.real;
      ((float*)retval)[1] = csum.imag;
      alen = 2;
      break;                                     
    case  C_DBL:
      *(double*)retval = dsum;
      alen = 1;
      break;                                     
    case  C_FLOAT:
      *(float*)retval = fsum;
      alen = 1;
      break;                                     
    case C_LONG:
      *(long*)retval = lsum;
      alen = 1;
      break;                                     
    case C_LONGLONG:
      *(long long*)retval = llsum;
      alen = 1;
      break;
     default:
        pnga_error("snga_dot_local_patch: type not supported",atype);
  }

  if (num_blocks_a < 0 && num_blocks_b < 0) {
    /* find out coordinates of patches of g_A and g_B that I own */
    pnga_distribution(g_A, me, loA, hiA);
    pnga_distribution(g_B, me, loB, hiB);

    if(pnga_comp_patch(andim, loA, hiA, bndim, loB, hiB) &&
        pnga_comp_patch(andim, alo, ahi, bndim, blo, bhi)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if(!(compatible && (transp=='n'))) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_a
       *        - copy & reshape patch of g_b into g_B
       */
      if (!pnga_duplicate(g_a, &g_B, tempname))
        pnga_error("duplicate failed",0L);

      pnga_copy_patch(&transp, g_b, blo, bhi, g_B, alo, ahi);
      bndim = andim;
      temp_created = 1;
      pnga_distribution(g_B, me, loB, hiB);
    }

    if(!pnga_comp_patch(andim, loA, hiA, bndim, loB, hiB))
      pnga_error(" patches mismatch ",0);

    /* A[83:125,1:1]  <==> B[83:125] */
    if(andim > bndim) andim = bndim; /* need more work */

    /*  determine subsets of my patches to access  */
    if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){
      pnga_access_ptr(g_A, loA, hiA, &A_ptr, ldA);
      pnga_access_ptr(g_B, loA, hiA, &B_ptr, ldB);

      snga_dot_local_patch(atype, andim, loA, hiA, ldA, A_ptr, B_ptr,
          &alen, retval);
      /* release access to the data */
      pnga_release(g_A, loA, hiA);
      pnga_release(g_B, loA, hiA);
    }
  } else {
    /* Create copy of g_b identical with identical distribution as g_a */
    if (!pnga_duplicate(g_a, &g_B, tempname))
      pnga_error("duplicate failed",0L);
    pnga_copy_patch(&transp, g_b, blo, bhi, g_B, alo, ahi);
    temp_created = 1;

#if 1
    pnga_local_iterator_init(g_a, &hdl_a);
    pnga_local_iterator_init(g_B, &hdl_b);
    while(pnga_local_iterator_next(&hdl_a, loA, hiA, &A_ptr, ldA)) {
      Integer lo[MAXDIM]/*, hi[MAXDIM]*/;
      Integer offset, jtot, last;
      pnga_local_iterator_next(&hdl_b, loB, hiB, &B_ptr, ldB);
      /* make copies of loA and hiA since pnga_patch_intersect destroys
         original versions */
      for (j=0; j<andim; j++) {
        lo[j] = loA[j];
        /*hi[j] = hiA[j];*/
      }
      if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){
        /* evaluate offsets for system */
        offset = 0;
        last = andim-1;
        jtot = 1;
        for (j=0; j<last; j++) {
          offset += (loA[j] - lo[j])*jtot;
          jtot *= ldA[j];
        }
        offset += (loA[last]-lo[last])*jtot;

        /* offset pointers by correct amount */
        switch (atype){
          case C_INT:
            A_ptr = (void*)((int*)(A_ptr) + offset);
            B_ptr = (void*)((int*)(B_ptr) + offset);
            break;                                     
          case C_DCPL:
            A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
            break;                                     
          case C_SCPL:
            A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
            break;                                     
          case  C_DBL:
            A_ptr = (void*)((double*)(A_ptr) + offset);
            B_ptr = (void*)((double*)(B_ptr) + offset);
            break;                                     
          case  C_FLOAT:
            A_ptr = (void*)((float*)(A_ptr) + offset);
            B_ptr = (void*)((float*)(B_ptr) + offset);
            break;                                     
          case C_LONG:
            A_ptr = (void*)((long*)(A_ptr) + offset);
            B_ptr = (void*)((long*)(B_ptr) + offset);
            break;                                     
          case C_LONGLONG:
            A_ptr = (void*)((long long*)(A_ptr) + offset);
            B_ptr = (void*)((long long*)(B_ptr) + offset);
            break;                                     
        }
        snga_dot_local_patch(atype, andim, loA, hiA, ldA, A_ptr, B_ptr,
            &alen, retval);
      }
    }
#else
    /* If g_a regular distribution, then just use normal dot product on patch */
    if (num_blocks_a < 0) {
      /* find out coordinates of patches of g_A and g_B that I own */
      pnga_distribution(g_A, me, loA, hiA);
      pnga_distribution(g_B, me, loB, hiB);

      if(!pnga_comp_patch(andim, loA, hiA, bndim, loB, hiB))
        pnga_error(" patches mismatch ",0);

      /* A[83:125,1:1]  <==> B[83:125] */
      if(andim > bndim) andim = bndim; /* need more work */
      if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){
        pnga_access_ptr(g_A, loA, hiA, &A_ptr, ldA);
        pnga_access_ptr(g_B, loA, hiA, &B_ptr, ldB);

        snga_dot_local_patch(atype, andim, loA, hiA, ldA, A_ptr, B_ptr,
            &alen, retval);
        /* release access to the data */
        pnga_release(g_A, loA, hiA);
        pnga_release(g_B, loA, hiA);
      }
    } else {
      Integer lo[MAXDIM]/*, hi[MAXDIM]*/;
      Integer offset, jtot, last;
      /* simple block cyclic data distribution */
      if (!pnga_uses_proc_grid(g_a)) {
        for (i=me; i<num_blocks_a; i += nproc) {
          pnga_distribution(g_A, i, loA, hiA);
          /* make copies of loA and hiA since pnga_patch_intersect destroys
             original versions */
          for (j=0; j<andim; j++) {
            lo[j] = loA[j];
            /*hi[j] = hiA[j];*/
          }
          if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){
            pnga_access_block_ptr(g_A, i, &A_ptr, ldA);
            pnga_access_block_ptr(g_B, i, &B_ptr, ldB);

            /* evaluate offsets for system */
            offset = 0;
            last = andim-1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loA[j] - lo[j])*jtot;
              jtot *= ldA[j];
            }
            offset += (loA[last]-lo[last])*jtot;

            /* offset pointers by correct amount */
            switch (atype){
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                break;                                     
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                break;                                     
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                break;                                     
              case  C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                break;                                     
              case  C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                break;                                     
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                break;                                     
              case C_LONGLONG:
                A_ptr = (void*)((long long*)(A_ptr) + offset);
                B_ptr = (void*)((long long*)(B_ptr) + offset);
                break;                                     
            }
            snga_dot_local_patch(atype, andim, loA, hiA, ldA, A_ptr, B_ptr,
                &alen, retval);
            /* release access to the data */
            pnga_release_block(g_A, i);
            pnga_release_block(g_B, i);
          }
        }
      } else {
        /* Uses scalapack block-cyclic data distribution */
        Integer proc_index[MAXDIM], index[MAXDIM];
        Integer topology[MAXDIM]/*, chk*/;
        Integer blocks[MAXDIM], block_dims[MAXDIM];
        pnga_get_proc_index(g_a, me, proc_index);
        pnga_get_proc_index(g_a, me, index);
        pnga_get_block_info(g_a, blocks, block_dims);
        pnga_get_proc_grid(g_a, topology);
        while (index[andim-1] < blocks[andim-1]) {
          /* find bounding coordinates of block */
          /*chk = 1;*/
          for (i = 0; i < andim; i++) {
            loA[i] = index[i]*block_dims[i]+1;
            hiA[i] = (index[i] + 1)*block_dims[i];
            if (hiA[i] > adims[i]) hiA[i] = adims[i];
            /*if (hiA[i] < loA[i]) chk = 0;*/
          }
          /* make copies of loA and hiA since pnga_patch_intersect destroys
             original versions */
          for (j=0; j<andim; j++) {
            lo[j] = loA[j];
            /*hi[j] = hiA[j];*/
          }
          if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){
            pnga_access_block_grid_ptr(g_A, index, &A_ptr, ldA);
            pnga_access_block_grid_ptr(g_B, index, &B_ptr, ldB);

            /* evaluate offsets for system */
            offset = 0;
            last = andim-1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loA[j] - lo[j])*jtot;
              jtot *= ldA[j];
            }
            offset += (loA[last]-lo[last])*jtot;

            /* offset pointers by correct amount */
            switch (atype){
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                break;                                     
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                break;                                     
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                break;                                     
              case  C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                break;                                     
              case  C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                break;                                     
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                break;                                     
              case C_LONGLONG:
                A_ptr = (void*)((long long*)(A_ptr) + offset);
                B_ptr = (void*)((long long*)(B_ptr) + offset);
                break;                                     
            }
            snga_dot_local_patch(atype, andim, loA, hiA, ldA, A_ptr, B_ptr,
                &alen, retval);
            /* release access to the data */
            pnga_release_block_grid(g_A, index);
            pnga_release_block_grid(g_B, index);
          }

          /* increment index to get next block on processor */
          index[0] += topology[0];
          for (i = 0; i < andim; i++) {
            if (index[i] >= blocks[i] && i<andim-1) {
              index[i] = proc_index[i];
              index[i+1] += topology[i+1];
            }
          }
        }
      }
    }
#endif
  }

  /*convert from C data type to ARMCI type */
  switch(atype) {
    case C_FLOAT: ctype=ARMCI_FLOAT; break;
    case C_DBL: ctype=ARMCI_DOUBLE; break;
    case C_INT: ctype=ARMCI_INT; break;
    case C_LONG: ctype=ARMCI_LONG; break;
    case C_LONGLONG: ctype=ARMCI_LONG_LONG; break;
    case C_DCPL: ctype=ARMCI_DOUBLE; break;
    case C_SCPL: ctype=ARMCI_FLOAT; break;
    default: pnga_error("pnga_dot_patch: type not supported",atype);
  }

  if (pnga_is_mirrored(g_a) && pnga_is_mirrored(g_b)) {
    armci_msg_gop_scope(SCOPE_NODE,retval,alen,"+",ctype);
  } else {
    if (a_grp == -1) {
      armci_msg_gop_scope(SCOPE_ALL,retval,alen,"+",ctype);
#ifdef MSG_COMMS_MPI
    } else {
      armci_msg_group_gop_scope(SCOPE_ALL,retval,alen,"+",ctype,
          ga_get_armci_group_((int)a_grp));
#endif
    }
  }

  if(temp_created) pnga_destroy(g_B);
}